

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O0

size_t __thiscall
avro::parsing::SimpleParser<avro::parsing::DummyHandler>::popSize
          (SimpleParser<avro::parsing::DummyHandler> *this)

{
  reference this_00;
  unsigned_long uVar1;
  size_t result;
  Symbol *s;
  
  this_00 = std::
            stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
            ::top((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                   *)0x22a87c);
  Symbol::kind(this_00);
  assertMatch(sTerminalLow,0x22a897);
  uVar1 = Symbol::extra<unsigned_long>((Symbol *)0x22a8a1);
  std::
  stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
         *)0x22a8b4);
  return uVar1;
}

Assistant:

size_t popSize() {
        const Symbol& s = parsingStack.top();
        assertMatch(Symbol::sSizeCheck, s.kind());
        size_t result = s.extra<size_t>();
        parsingStack.pop();
        return result;
    }